

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O1

ostream * std::operator<<(ostream *ofs,matrix2d *m)

{
  ostream *poVar1;
  _anonymous_namespace_ *p_Var2;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"( ",2);
  p_Var2 = (_anonymous_namespace_ *)0x3f2386;
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"(",1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_68,p_Var2,m->m[0][0]);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (ofs,local_68._M_dataplus._M_p,local_68._M_string_length);
  p_Var2 = (_anonymous_namespace_ *)0x407114;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_48,p_Var2,m->m[0][1]);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = (_anonymous_namespace_ *)0x3f2386;
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"(",1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_68,p_Var2,m->m[1][0]);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (ofs,local_68._M_dataplus._M_p,local_68._M_string_length);
  p_Var2 = (_anonymous_namespace_ *)0x407114;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_48,p_Var2,m->m[1][1]);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ofs," )",2);
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::matrix2d &m) {
  ofs << "( ";

  ofs << "(" << tinyusdz::dtos(m.m[0][0]) << ", " << tinyusdz::dtos(m.m[0][1])
      << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[1][0]) << ", " << tinyusdz::dtos(m.m[1][1])
      << ")";

  ofs << " )";

  return ofs;
}